

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O3

void __thiscall
SolverAppTest_IgnoreFirstArgument_Test::~SolverAppTest_IgnoreFirstArgument_Test
          (SolverAppTest_IgnoreFirstArgument_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_SolverAppTest).super_Test._vptr_Test = (_func_int **)&PTR__SolverAppTest_0028edf8;
  (this->super_SolverAppTest).output_handler_.super_OutputHandler._vptr_OutputHandler =
       (_func_int **)&PTR__OutputHandler_0028a0d8;
  pcVar2 = (this->super_SolverAppTest).output_handler_.output._M_dataplus._M_p;
  paVar1 = &(this->super_SolverAppTest).output_handler_.output.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::StrictMock<MockOptionHandler>::~StrictMock
            (&(this->super_SolverAppTest).handler_.super_StrictMock<MockOptionHandler>);
  mp::SolverApp<TestSolver,_testing::StrictMock<MockNLReader<TestSolver>_>_>::~SolverApp
            (&(this->super_SolverAppTest).app_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x5f8);
  return;
}

Assistant:

TEST_F(SolverAppTest, IgnoreFirstArgument) {
  AddOption();
  RedirectOutput();
  EXPECT_EQ(0, app_.Run(Args("-w")));
}